

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_spec.cpp
# Opt level: O1

void parseGPLFile(filebuf *file)

{
  ushort uVar1;
  pointer paVar2;
  bool bVar3;
  ushort i;
  uint uVar4;
  optional<Rgba> oVar5;
  uint uVar6;
  string line;
  size_type n;
  ushort local_84;
  string local_68;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_> *local_38;
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  readLine(file,&local_68);
  local_48._M_len = local_68._M_string_length;
  local_48._M_str = local_68._M_dataplus._M_p;
  bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::starts_with
                    (&local_48,"GIMP Palette");
  if (bVar3) {
    uVar6 = (uint)options.nbPalettes;
    uVar4 = (uint)options.nbColorsPerPal;
    uVar1 = 0;
    local_38 = &options.palSpec;
    do {
      do {
        do {
          do {
            local_68._M_string_length = 0;
            *local_68._M_dataplus._M_p = '\0';
            readLine(file,&local_68);
            local_84 = (ushort)(uVar6 * uVar4);
            if (local_68._M_string_length == 0) {
              if (local_84 < uVar1) {
                warning("GPL file contains %u colors, but there can only be %u; ignoring extra",
                        (ulong)uVar1,(ulong)(uVar6 * uVar4));
              }
              goto LAB_0010cc6a;
            }
            local_48._M_len = local_68._M_string_length;
            local_48._M_str = local_68._M_dataplus._M_p;
            bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::starts_with
                              (&local_48,"#");
          } while (bVar3);
          local_48._M_len = local_68._M_string_length;
          local_48._M_str = local_68._M_dataplus._M_p;
          bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::starts_with
                            (&local_48,"Name:");
        } while (bVar3);
        local_48._M_len = local_68._M_string_length;
        local_48._M_str = local_68._M_dataplus._M_p;
        bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::starts_with
                          (&local_48,"Column:");
      } while (bVar3);
      local_48._M_len = 0;
      i = uVar1 + 1;
      oVar5 = parseColor(&local_68,&local_48._M_len,i);
      if ((((uint5)oVar5.super__Optional_base<Rgba,_true,_true>._M_payload.
                   super__Optional_payload_base<Rgba> & 0x100000000) != 0) &&
         (uVar1 = i, i < local_84)) {
        if ((uint)i % (uint)options.nbColorsPerPal == 1) {
          if (options.palSpec.
              super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              options.palSpec.
              super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::
            _M_realloc_insert<>(local_38,(iterator)
                                         options.palSpec.
                                         super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish);
          }
          else {
            paVar2 = options.palSpec.
                     super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            paVar2->_M_elems[0].red = '\0';
            paVar2->_M_elems[0].green = '\0';
            paVar2->_M_elems[0].blue = '\0';
            paVar2->_M_elems[0].alpha = '\0';
            paVar2->_M_elems[1].red = '\0';
            paVar2->_M_elems[1].green = '\0';
            paVar2->_M_elems[1].blue = '\0';
            paVar2->_M_elems[1].alpha = '\0';
            paVar2->_M_elems[2].red = '\0';
            paVar2->_M_elems[2].green = '\0';
            paVar2->_M_elems[2].blue = '\0';
            paVar2->_M_elems[2].alpha = '\0';
            paVar2->_M_elems[3].red = '\0';
            paVar2->_M_elems[3].green = '\0';
            paVar2->_M_elems[3].blue = '\0';
            paVar2->_M_elems[3].alpha = '\0';
            options.palSpec.
            super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 options.palSpec.
                 super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
        *(_Storage<Rgba,_true> *)
         (options.palSpec.
          super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl
          .super__Vector_impl_data._M_finish[-1]._M_elems +
         (ulong)(uint)i % (ulong)options.nbColorsPerPal) =
             oVar5.super__Optional_base<Rgba,_true,_true>._M_payload.
             super__Optional_payload_base<Rgba>._M_payload;
      }
    } while (((uint5)oVar5.super__Optional_base<Rgba,_true,_true>._M_payload.
                     super__Optional_payload_base<Rgba> & 0x100000000) != 0);
  }
  else {
    error("Palette file does not appear to be a GPL palette file");
  }
LAB_0010cc6a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

static void parseGPLFile(std::filebuf &file) {
	// https://gitlab.gnome.org/GNOME/gimp/-/blob/gimp-2-10/app/core/gimppalette-load.c#L39

	std::string line;
	readLine(file, line);
	if (!line.starts_with("GIMP Palette")) {
		error("Palette file does not appear to be a GPL palette file");
		return;
	}

	uint16_t nbColors = 0;
	uint16_t maxNbColors = options.nbColorsPerPal * options.nbPalettes;

	for (;;) {
		line.clear();
		readLine(file, line);
		if (!line.length()) {
			break;
		}

		if (line.starts_with("#") || line.starts_with("Name:") || line.starts_with("Column:")) {
			continue;
		}

		std::string::size_type n = 0;
		std::optional<Rgba> color = parseColor(line, n, nbColors + 1);
		if (!color) {
			return;
		}

		++nbColors;
		if (nbColors < maxNbColors) {
			if (nbColors % options.nbColorsPerPal == 1) {
				options.palSpec.emplace_back();
			}
			options.palSpec.back()[nbColors % options.nbColorsPerPal] = *color;
		}
	}

	if (nbColors > maxNbColors) {
		warning("GPL file contains %" PRIu16 " colors, but there can only be %" PRIu16
		        "; ignoring extra",
		        nbColors, maxNbColors);
	}
}